

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  Geometry *this;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  byte bVar33;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar34;
  bool bVar35;
  long lVar36;
  byte bVar37;
  size_t i;
  long lVar38;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar39;
  byte bVar40;
  size_t sVar41;
  long lVar42;
  bool bVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar61 [64];
  long lStack_2500;
  undefined1 local_24e8 [16];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24e8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_24e8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  pSVar39 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar56._4_4_ = fVar1;
  auVar56._0_4_ = fVar1;
  auVar56._8_4_ = fVar1;
  auVar56._12_4_ = fVar1;
  auVar56._16_4_ = fVar1;
  auVar56._20_4_ = fVar1;
  auVar56._24_4_ = fVar1;
  auVar56._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar57._4_4_ = fVar2;
  auVar57._0_4_ = fVar2;
  auVar57._8_4_ = fVar2;
  auVar57._12_4_ = fVar2;
  auVar57._16_4_ = fVar2;
  auVar57._20_4_ = fVar2;
  auVar57._24_4_ = fVar2;
  auVar57._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar58._4_4_ = fVar3;
  auVar58._0_4_ = fVar3;
  auVar58._8_4_ = fVar3;
  auVar58._12_4_ = fVar3;
  auVar58._16_4_ = fVar3;
  auVar58._20_4_ = fVar3;
  auVar58._24_4_ = fVar3;
  auVar58._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar51._4_4_ = uVar4;
  auVar51._0_4_ = uVar4;
  auVar51._8_4_ = uVar4;
  auVar51._12_4_ = uVar4;
  auVar51._16_4_ = uVar4;
  auVar51._20_4_ = uVar4;
  auVar51._24_4_ = uVar4;
  auVar51._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar53._4_4_ = uVar4;
  auVar53._0_4_ = uVar4;
  auVar53._8_4_ = uVar4;
  auVar53._12_4_ = uVar4;
  auVar53._16_4_ = uVar4;
  auVar53._20_4_ = uVar4;
  auVar53._24_4_ = uVar4;
  auVar53._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar48._4_4_ = uVar4;
  auVar48._0_4_ = uVar4;
  auVar48._8_4_ = uVar4;
  auVar48._12_4_ = uVar4;
  auVar48._16_4_ = uVar4;
  auVar48._20_4_ = uVar4;
  auVar48._24_4_ = uVar4;
  auVar48._28_4_ = uVar4;
  bVar35 = false;
  auVar23 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar59 = ZEXT3264(auVar23);
  auVar60 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar23 = vsubps_avx(auVar56,auVar51);
    fVar12 = auVar51._0_4_;
    fVar13 = auVar51._4_4_;
    fVar14 = auVar51._8_4_;
    fVar15 = auVar51._12_4_;
    fVar16 = auVar51._16_4_;
    fVar17 = auVar51._20_4_;
    fVar18 = auVar51._24_4_;
    auVar19 = vsubps_avx(auVar57,auVar53);
    auVar20 = vsubps_avx(auVar58,auVar48);
    auVar54._0_4_ = fVar3 + auVar48._0_4_;
    auVar54._4_4_ = fVar3 + auVar48._4_4_;
    auVar54._8_4_ = fVar3 + auVar48._8_4_;
    auVar54._12_4_ = fVar3 + auVar48._12_4_;
    auVar54._16_4_ = fVar3 + auVar48._16_4_;
    auVar54._20_4_ = fVar3 + auVar48._20_4_;
    auVar54._24_4_ = fVar3 + auVar48._24_4_;
    auVar54._28_4_ = fVar3 + auVar48._28_4_;
    auVar61._0_4_ = fVar12 * fVar12;
    auVar61._4_4_ = fVar13 * fVar13;
    auVar61._8_4_ = fVar14 * fVar14;
    auVar61._12_4_ = fVar15 * fVar15;
    auVar61._16_4_ = fVar16 * fVar16;
    auVar61._20_4_ = fVar17 * fVar17;
    auVar61._28_36_ = in_ZMM14._28_36_;
    auVar61._24_4_ = fVar18 * fVar18;
    in_ZMM14 = ZEXT3264(auVar61._0_32_);
LAB_01c5d4ab:
    do {
      if (pSVar39 == stack) {
        return bVar35;
      }
      pSVar34 = pSVar39 + -1;
      pSVar39 = pSVar39 + -1;
    } while ((float)local_24e8._0_4_ < (float)pSVar34->dist);
    sVar41 = (pSVar39->ptr).ptr;
LAB_01c5d4c9:
    while (context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar41 & 8) != 0) goto LAB_01c5d90e;
      auVar48 = *(undefined1 (*) [32])(sVar41 + 0x40);
      auVar21 = *(undefined1 (*) [32])(sVar41 + 0x60);
      auVar45 = vmaxps_avx(auVar56,auVar48);
      auVar45 = vminps_avx(auVar45,auVar21);
      auVar47 = vsubps_avx(auVar45,auVar56);
      auVar45 = vmaxps_avx(auVar57,*(undefined1 (*) [32])(sVar41 + 0x80));
      auVar45 = vminps_avx(auVar45,*(undefined1 (*) [32])(sVar41 + 0xa0));
      auVar46 = vsubps_avx(auVar45,auVar57);
      auVar45 = vmaxps_avx(auVar58,*(undefined1 (*) [32])(sVar41 + 0xc0));
      auVar45 = vminps_avx(auVar45,*(undefined1 (*) [32])(sVar41 + 0xe0));
      auVar45 = vsubps_avx(auVar45,auVar58);
      auVar52._0_4_ =
           auVar47._0_4_ * auVar47._0_4_ + auVar46._0_4_ * auVar46._0_4_ +
           auVar45._0_4_ * auVar45._0_4_;
      auVar52._4_4_ =
           auVar47._4_4_ * auVar47._4_4_ + auVar46._4_4_ * auVar46._4_4_ +
           auVar45._4_4_ * auVar45._4_4_;
      auVar52._8_4_ =
           auVar47._8_4_ * auVar47._8_4_ + auVar46._8_4_ * auVar46._8_4_ +
           auVar45._8_4_ * auVar45._8_4_;
      auVar52._12_4_ =
           auVar47._12_4_ * auVar47._12_4_ + auVar46._12_4_ * auVar46._12_4_ +
           auVar45._12_4_ * auVar45._12_4_;
      auVar52._16_4_ =
           auVar47._16_4_ * auVar47._16_4_ + auVar46._16_4_ * auVar46._16_4_ +
           auVar45._16_4_ * auVar45._16_4_;
      auVar52._20_4_ =
           auVar47._20_4_ * auVar47._20_4_ + auVar46._20_4_ * auVar46._20_4_ +
           auVar45._20_4_ * auVar45._20_4_;
      auVar52._24_4_ =
           auVar47._24_4_ * auVar47._24_4_ + auVar46._24_4_ * auVar46._24_4_ +
           auVar45._24_4_ * auVar45._24_4_;
      auVar52._28_4_ = auVar47._28_4_ + auVar46._28_4_ + auVar46._28_4_;
      uVar32 = vcmpps_avx512vl(auVar48,auVar21,2);
      uVar26 = vcmpps_avx512vl(auVar21,auVar23,1);
      auVar45._4_4_ = fVar1 + fVar13;
      auVar45._0_4_ = fVar1 + fVar12;
      auVar45._8_4_ = fVar1 + fVar14;
      auVar45._12_4_ = fVar1 + fVar15;
      auVar45._16_4_ = fVar1 + fVar16;
      auVar45._20_4_ = fVar1 + fVar17;
      auVar45._24_4_ = fVar1 + fVar18;
      auVar45._28_4_ = fVar1 + auVar51._28_4_;
      uVar27 = vcmpps_avx512vl(auVar48,auVar45,6);
      uVar28 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar41 + 0xa0),auVar19,1);
      auVar21._4_4_ = fVar2 + auVar53._4_4_;
      auVar21._0_4_ = fVar2 + auVar53._0_4_;
      auVar21._8_4_ = fVar2 + auVar53._8_4_;
      auVar21._12_4_ = fVar2 + auVar53._12_4_;
      auVar21._16_4_ = fVar2 + auVar53._16_4_;
      auVar21._20_4_ = fVar2 + auVar53._20_4_;
      auVar21._24_4_ = fVar2 + auVar53._24_4_;
      auVar21._28_4_ = fVar2 + auVar53._28_4_;
      uVar29 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar41 + 0x80),auVar21,6);
      uVar30 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar41 + 0xe0),auVar20,1);
      uVar31 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar41 + 0xc0),auVar54,6);
      uVar44 = (ulong)(byte)(~((byte)uVar29 | (byte)uVar27 | (byte)uVar31 | (byte)uVar26 |
                              (byte)uVar28 | (byte)uVar30) & (byte)uVar32);
LAB_01c5d54c:
      bVar37 = (byte)uVar44;
      if (bVar37 == 0) goto LAB_01c5d4ab;
      auVar48 = *(undefined1 (*) [32])(sVar41 & 0xfffffffffffffff0);
      auVar21 = ((undefined1 (*) [32])(sVar41 & 0xfffffffffffffff0))[1];
      auVar45 = vpternlogd_avx512vl(auVar59._0_32_,auVar52,auVar60._0_32_,0xf8);
      auVar46 = vpcompressd_avx512vl(auVar45);
      auVar47._0_4_ = (uint)(bVar37 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar45._0_4_
      ;
      bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar43 * auVar46._4_4_ | (uint)!bVar43 * auVar45._4_4_;
      bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar43 * auVar46._8_4_ | (uint)!bVar43 * auVar45._8_4_;
      bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
      auVar47._12_4_ = (uint)bVar43 * auVar46._12_4_ | (uint)!bVar43 * auVar45._12_4_;
      bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
      auVar47._16_4_ = (uint)bVar43 * auVar46._16_4_ | (uint)!bVar43 * auVar45._16_4_;
      bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
      auVar47._20_4_ = (uint)bVar43 * auVar46._20_4_ | (uint)!bVar43 * auVar45._20_4_;
      bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
      auVar47._24_4_ = (uint)bVar43 * auVar46._24_4_ | (uint)!bVar43 * auVar45._24_4_;
      bVar43 = SUB81(uVar44 >> 7,0);
      auVar47._28_4_ = (uint)bVar43 * auVar46._28_4_ | (uint)!bVar43 * auVar45._28_4_;
      auVar45 = vpermt2q_avx512vl(auVar48,auVar47,auVar21);
      sVar41 = auVar45._0_8_;
      bVar37 = bVar37 - 1 & bVar37;
      if (bVar37 != 0) goto LAB_01c5d68c;
    }
    if ((sVar41 & 8) == 0) {
      auVar48 = vmaxps_avx(auVar56,*(undefined1 (*) [32])(sVar41 + 0x40));
      auVar48 = vminps_avx(auVar48,*(undefined1 (*) [32])(sVar41 + 0x60));
      auVar21 = vsubps_avx(auVar48,auVar56);
      auVar48 = vmaxps_avx(auVar57,*(undefined1 (*) [32])(sVar41 + 0x80));
      auVar48 = vminps_avx(auVar48,*(undefined1 (*) [32])(sVar41 + 0xa0));
      auVar45 = vsubps_avx(auVar48,auVar57);
      auVar48 = vmaxps_avx(auVar58,*(undefined1 (*) [32])(sVar41 + 0xc0));
      auVar48 = vminps_avx(auVar48,*(undefined1 (*) [32])(sVar41 + 0xe0));
      auVar48 = vsubps_avx(auVar48,auVar58);
      auVar52._0_4_ =
           auVar21._0_4_ * auVar21._0_4_ + auVar45._0_4_ * auVar45._0_4_ +
           auVar48._0_4_ * auVar48._0_4_;
      auVar52._4_4_ =
           auVar21._4_4_ * auVar21._4_4_ + auVar45._4_4_ * auVar45._4_4_ +
           auVar48._4_4_ * auVar48._4_4_;
      auVar52._8_4_ =
           auVar21._8_4_ * auVar21._8_4_ + auVar45._8_4_ * auVar45._8_4_ +
           auVar48._8_4_ * auVar48._8_4_;
      auVar52._12_4_ =
           auVar21._12_4_ * auVar21._12_4_ + auVar45._12_4_ * auVar45._12_4_ +
           auVar48._12_4_ * auVar48._12_4_;
      auVar52._16_4_ =
           auVar21._16_4_ * auVar21._16_4_ + auVar45._16_4_ * auVar45._16_4_ +
           auVar48._16_4_ * auVar48._16_4_;
      auVar52._20_4_ =
           auVar21._20_4_ * auVar21._20_4_ + auVar45._20_4_ * auVar45._20_4_ +
           auVar48._20_4_ * auVar48._20_4_;
      auVar52._24_4_ =
           auVar21._24_4_ * auVar21._24_4_ + auVar45._24_4_ * auVar45._24_4_ +
           auVar48._24_4_ * auVar48._24_4_;
      auVar52._28_4_ = auVar21._28_4_ + auVar45._28_4_ + auVar45._28_4_;
      uVar44 = vcmpps_avx512vl(auVar52,in_ZMM14._0_32_,2);
      uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar41 + 0x40),
                               *(undefined1 (*) [32])(sVar41 + 0x60),2);
      uVar44 = uVar44 & uVar25;
      goto LAB_01c5d54c;
    }
LAB_01c5d90e:
    lVar42 = (sVar41 & 0xfffffffffffffff0) + 0x40;
    bVar37 = 0;
    lVar36 = 0;
    while (lVar36 != (ulong)((uint)sVar41 & 0xf) - 8) {
      bVar40 = 0;
      for (lVar38 = 0; (lVar38 != 4 && (*(int *)(lVar42 + lVar38 * 4) != -1)); lVar38 = lVar38 + 1)
      {
        uVar6 = *(uint *)(lVar42 + -0x10 + lVar38 * 4);
        this = (context->scene->geometries).items[uVar6].ptr;
        context->geomID = uVar6;
        context->primID = *(uint *)(lVar42 + lVar38 * 4);
        bVar43 = Geometry::pointQuery(this,query,context);
        in_ZMM14 = ZEXT3264(auVar61._0_32_);
        bVar40 = bVar40 | bVar43;
      }
      bVar37 = bVar37 | bVar40;
      lVar36 = lVar36 + 1;
      lVar42 = lVar42 + 0x50;
      auVar48 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar59 = ZEXT3264(auVar48);
      auVar60 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
    }
    if (bVar37 == 0) goto LAB_01c5d4ab;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar51._4_4_ = uVar4;
    auVar51._0_4_ = uVar4;
    auVar51._8_4_ = uVar4;
    auVar51._12_4_ = uVar4;
    auVar51._16_4_ = uVar4;
    auVar51._20_4_ = uVar4;
    auVar51._24_4_ = uVar4;
    auVar51._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar53._4_4_ = uVar4;
    auVar53._0_4_ = uVar4;
    auVar53._8_4_ = uVar4;
    auVar53._12_4_ = uVar4;
    auVar53._16_4_ = uVar4;
    auVar53._20_4_ = uVar4;
    auVar53._24_4_ = uVar4;
    auVar53._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar48._4_4_ = uVar4;
    auVar48._0_4_ = uVar4;
    auVar48._8_4_ = uVar4;
    auVar48._12_4_ = uVar4;
    auVar48._16_4_ = uVar4;
    auVar48._20_4_ = uVar4;
    auVar48._24_4_ = uVar4;
    auVar48._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_24e8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      local_24e8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    }
    bVar35 = true;
  } while( true );
LAB_01c5d68c:
  auVar45 = vpshufd_avx2(auVar47,0x55);
  vpermt2q_avx512vl(auVar48,auVar45,auVar21);
  auVar46 = vpminsd_avx2(auVar47,auVar45);
  auVar45 = vpmaxsd_avx2(auVar47,auVar45);
  bVar37 = bVar37 - 1 & bVar37;
  if (bVar37 == 0) {
    auVar47 = vpermi2q_avx512vl(auVar46,auVar48,auVar21);
    sVar41 = auVar47._0_8_;
    auVar48 = vpermt2q_avx512vl(auVar48,auVar45,auVar21);
    (pSVar39->ptr).ptr = auVar48._0_8_;
    lVar36 = 8;
    lStack_2500 = 0x10;
  }
  else {
    auVar24 = vpshufd_avx2(auVar47,0xaa);
    vpermt2q_avx512vl(auVar48,auVar24,auVar21);
    auVar50 = vpminsd_avx2(auVar46,auVar24);
    auVar46 = vpmaxsd_avx2(auVar46,auVar24);
    auVar24 = vpminsd_avx2(auVar45,auVar46);
    auVar46 = vpmaxsd_avx2(auVar45,auVar46);
    bVar37 = bVar37 - 1 & bVar37;
    if (bVar37 == 0) {
      auVar45 = vpermi2q_avx512vl(auVar50,auVar48,auVar21);
      sVar41 = auVar45._0_8_;
      auVar45 = vpermt2q_avx512vl(auVar48,auVar46,auVar21);
      (pSVar39->ptr).ptr = auVar45._0_8_;
      auVar45 = vpermd_avx2(auVar46,auVar52);
      pSVar39->dist = auVar45._0_4_;
      auVar48 = vpermt2q_avx512vl(auVar48,auVar24,auVar21);
      pSVar39[1].ptr.ptr = auVar48._0_8_;
      lStack_2500 = 0x18;
      lVar36 = lStack_2500;
      lStack_2500 = 0x20;
      auVar45 = auVar24;
    }
    else {
      auVar45 = vpshufd_avx2(auVar47,0xff);
      vpermt2q_avx512vl(auVar48,auVar45,auVar21);
      auVar22 = vpminsd_avx2(auVar50,auVar45);
      auVar50 = vpmaxsd_avx2(auVar50,auVar45);
      auVar45 = vpminsd_avx2(auVar24,auVar50);
      auVar50 = vpmaxsd_avx2(auVar24,auVar50);
      auVar24 = vpminsd_avx2(auVar46,auVar50);
      auVar46 = vpmaxsd_avx2(auVar46,auVar50);
      bVar37 = bVar37 - 1 & bVar37;
      if (bVar37 != 0) {
        auVar49 = valignd_avx512vl(auVar47,auVar47,3);
        auVar47 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar50 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar47,auVar22);
        auVar47 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar45 = vpermt2d_avx512vl(auVar50,auVar47,auVar45);
        auVar47 = vpermt2d_avx512vl(auVar45,auVar47,auVar24);
        auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar45 = vpermt2d_avx512vl(auVar47,auVar45,auVar46);
        auVar55 = ZEXT3264(auVar45);
        bVar40 = bVar37;
        do {
          auVar47 = auVar55._0_32_;
          auVar46._8_4_ = 1;
          auVar46._0_8_ = 0x100000001;
          auVar46._12_4_ = 1;
          auVar46._16_4_ = 1;
          auVar46._20_4_ = 1;
          auVar46._24_4_ = 1;
          auVar46._28_4_ = 1;
          auVar45 = vpermd_avx2(auVar46,auVar49);
          auVar49 = valignd_avx512vl(auVar49,auVar49,1);
          vpermt2q_avx512vl(auVar48,auVar49,auVar21);
          bVar40 = bVar40 - 1 & bVar40;
          uVar32 = vpcmpd_avx512vl(auVar45,auVar47,5);
          auVar45 = vpmaxsd_avx2(auVar45,auVar47);
          bVar33 = (byte)uVar32 << 1;
          auVar47 = valignd_avx512vl(auVar47,auVar47,7);
          bVar43 = (bool)((byte)uVar32 & 1);
          bVar7 = (bool)(bVar33 >> 2 & 1);
          bVar8 = (bool)(bVar33 >> 3 & 1);
          bVar9 = (bool)(bVar33 >> 4 & 1);
          bVar10 = (bool)(bVar33 >> 5 & 1);
          bVar11 = (bool)(bVar33 >> 6 & 1);
          auVar55 = ZEXT3264(CONCAT428((uint)(bVar33 >> 7) * auVar47._28_4_ |
                                       (uint)!(bool)(bVar33 >> 7) * auVar45._28_4_,
                                       CONCAT424((uint)bVar11 * auVar47._24_4_ |
                                                 (uint)!bVar11 * auVar45._24_4_,
                                                 CONCAT420((uint)bVar10 * auVar47._20_4_ |
                                                           (uint)!bVar10 * auVar45._20_4_,
                                                           CONCAT416((uint)bVar9 * auVar47._16_4_ |
                                                                     (uint)!bVar9 * auVar45._16_4_,
                                                                     CONCAT412((uint)bVar8 *
                                                                               auVar47._12_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar45._12_4_,
                                                                               CONCAT48((uint)bVar7
                                                                                        * auVar47.
                                                  _8_4_ | (uint)!bVar7 * auVar45._8_4_,
                                                  CONCAT44((uint)bVar43 * auVar47._4_4_ |
                                                           (uint)!bVar43 * auVar45._4_4_,
                                                           auVar45._0_4_))))))));
        } while (bVar40 != 0);
        lVar36 = (ulong)(uint)POPCOUNT((uint)bVar37) + 3;
        while( true ) {
          auVar47 = auVar55._0_32_;
          auVar45 = vpermt2q_avx512vl(auVar48,auVar47,auVar21);
          sVar41 = auVar45._0_8_;
          bVar43 = lVar36 == 0;
          lVar36 = lVar36 + -1;
          if (bVar43) break;
          (pSVar39->ptr).ptr = sVar41;
          auVar45 = vpermd_avx2(auVar47,auVar52);
          pSVar39->dist = auVar45._0_4_;
          auVar45 = valignd_avx512vl(auVar47,auVar47,1);
          auVar55 = ZEXT3264(auVar45);
          pSVar39 = pSVar39 + 1;
        }
        in_ZMM14 = ZEXT3264(in_ZMM14._0_32_);
        goto LAB_01c5d4c9;
      }
      auVar47 = vpermi2q_avx512vl(auVar22,auVar48,auVar21);
      sVar41 = auVar47._0_8_;
      auVar47 = vpermt2q_avx512vl(auVar48,auVar46,auVar21);
      (pSVar39->ptr).ptr = auVar47._0_8_;
      auVar47 = vpermd_avx2(auVar46,auVar52);
      pSVar39->dist = auVar47._0_4_;
      auVar47 = vpermt2q_avx512vl(auVar48,auVar24,auVar21);
      pSVar39[1].ptr.ptr = auVar47._0_8_;
      auVar47 = vpermd_avx2(auVar24,auVar52);
      pSVar39[1].dist = auVar47._0_4_;
      auVar48 = vpermt2q_avx512vl(auVar48,auVar45,auVar21);
      pSVar39[2].ptr.ptr = auVar48._0_8_;
      lVar36 = 0x28;
      lStack_2500 = 0x30;
    }
  }
  auVar48 = vpermd_avx2(auVar45,auVar52);
  *(int *)((long)&(pSVar39->ptr).ptr + lVar36) = auVar48._0_4_;
  pSVar39 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar39->ptr).ptr + lStack_2500);
  goto LAB_01c5d4c9;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }